

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

_Bool import_encrypted(Filename *filename,int type,char **comment)

{
  LoadedFile *lf_00;
  _Bool toret;
  LoadedFile *lf;
  char **comment_local;
  int type_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,(char **)0x0);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    filename_local._7_1_ = import_encrypted_s(filename,lf_00->binarysource_,type,comment);
    lf_free(lf_00);
  }
  return filename_local._7_1_;
}

Assistant:

bool import_encrypted(const Filename *filename, int type, char **comment)
{
    LoadedFile *lf = lf_load_keyfile(filename, NULL);
    if (!lf)
        return false; /* couldn't even open the file */

    bool toret = import_encrypted_s(filename, BinarySource_UPCAST(lf),
                                    type, comment);
    lf_free(lf);
    return toret;
}